

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quic_unacked_packet_map.cc
# Opt level: O3

void __thiscall
quic::QuicUnackedPacketMap::PickLostPackets
          (QuicUnackedPacketMap *this,list<unsigned_short,_std::allocator<unsigned_short>_> *packets
          ,uint16_t latest_number)

{
  size_t *psVar1;
  ushort uVar2;
  _List_node_base *p_Var3;
  QuicByteCount QVar4;
  int iVar5;
  QuicByteCount QVar6;
  int iVar7;
  uint uVar8;
  undefined6 in_register_00000012;
  
  iVar7 = (int)CONCAT62(in_register_00000012,latest_number);
  uVar2 = this->_least_unack_packet_number;
  iVar5 = (uint)uVar2 - iVar7;
  if (iVar5 == 0x8000) {
    if (latest_number < uVar2) {
      return;
    }
  }
  else if (uVar2 != latest_number && -1 < (short)iVar5) {
    return;
  }
  do {
    uVar8 = iVar7 - (uint)uVar2;
    if (uVar8 == 0x8000) {
      if (latest_number <= uVar2) goto LAB_0011b4b6;
    }
    else if ((uVar2 == latest_number) || ((uVar8 & 0x8000) != 0)) {
LAB_0011b4b6:
      this->_least_unack_packet_number = latest_number;
      return;
    }
    iVar5 = this->_unack_sequence_numbers[uVar2];
    if ((long)iVar5 != -1) {
      p_Var3 = (_List_node_base *)operator_new(0x18);
      *(short *)&p_Var3[1]._M_next = (short)iVar5;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(packets->super__List_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                ._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      QVar6 = this->_bytes_in_flight - (ulong)*(ushort *)(&this->field_0x10 + (long)iVar5 * 0x28);
      if (this->_bytes_in_flight < (ulong)*(ushort *)(&this->field_0x10 + (long)iVar5 * 0x28)) {
        QVar6 = 0;
      }
      QVar4 = this->_packets_in_flight - 1;
      if (this->_packets_in_flight == 0) {
        QVar4 = 0;
      }
      this->_bytes_in_flight = QVar6;
      this->_packets_in_flight = QVar4;
      uVar2 = this->_least_unack_packet_number;
      this->_unack_sequence_numbers[uVar2] = -1;
    }
    uVar2 = uVar2 + 1;
    this->_least_unack_packet_number = uVar2;
  } while( true );
}

Assistant:

void QuicUnackedPacketMap::PickLostPackets(std::list<uint16_t> &packets, uint16_t latest_number)
	{
		if (IsNewer(_least_unack_packet_number, latest_number))
			return;
		int32_t sequence_number = -1;
		while (IsNewer(latest_number, _least_unack_packet_number)) {
			sequence_number = _unack_sequence_numbers[_least_unack_packet_number];
			if (sequence_number != -1) {
				packets.push_back(sequence_number);
#ifdef OUTPUT_VERBOSE_INFO
				dd::OutputDebugInfo("PickLostPackets packet lost, packet number = %d, sequence number = %d\r\n",
					_least_unack_packet_number, sequence_number);
#endif

				ReduceInflightPacket(sequence_number);
				_unack_sequence_numbers[_least_unack_packet_number] = -1;
			}

			_least_unack_packet_number++;

#ifdef OUTPUT_VERBOSE_INFO
			dd::OutputDebugInfo("PickLostPackets _unack_sequence_numbers[%d] = -1\r\n", _least_unack_packet_number);
#endif
		}
		_least_unack_packet_number = latest_number;

#ifdef OUTPUT_VERBOSE_INFO
		dd::OutputDebugInfo("PickLostPackets set _least_unack_packet_number = %d\r\n", _least_unack_packet_number);
#endif
	}